

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

RequestHolder * __thiscall
ot::commissioner::coap::Coap::RequestsCache::Match(RequestsCache *this,Response *aResponse)

{
  bool bVar1;
  _Base_ptr p_Var2;
  RequestPtr request;
  RequestHolder *local_48;
  __shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  p_Var2 = (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(this->mContainer)._M_t._M_impl.super__Rb_tree_header) {
      return (RequestHolder *)0x0;
    }
    std::__shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2> *)
               (p_Var2 + 1));
    if (aResponse->mEndpoint == (local_40._M_ptr)->mEndpoint) {
      if ((undefined1  [12])((undefined1  [12])aResponse->mHeader & (undefined1  [12])0x8) !=
          (undefined1  [12])0x0) {
        if ((aResponse->mHeader).mMessageId == ((local_40._M_ptr)->mHeader).mMessageId)
        goto LAB_001a0cbd;
        goto LAB_001a0c81;
      }
      bVar1 = Message::IsTokenEqual(aResponse,local_40._M_ptr);
      if (!bVar1) goto LAB_001a0c81;
LAB_001a0cbd:
      bVar1 = false;
      local_48 = (RequestHolder *)(p_Var2 + 1);
    }
    else {
LAB_001a0c81:
      bVar1 = true;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    if (!bVar1) {
      return local_48;
    }
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

const Coap::RequestHolder *Coap::RequestsCache::Match(const Response &aResponse) const
{
    for (const auto &requestHolder : mContainer)
    {
        const auto request = requestHolder.mRequest;

        if (aResponse.GetEndpoint() == request->GetEndpoint())
        {
            switch (aResponse.GetType())
            {
            case Type::kReset:
            case Type::kAcknowledgment:
                if (aResponse.GetMessageId() == request->GetMessageId())
                {
                    return &requestHolder;
                }
                break;
            case Type::kConfirmable:
            case Type::kNonConfirmable:
                if (aResponse.IsTokenEqual(*request))
                {
                    return &requestHolder;
                }
                break;
            }
        }
    }
    return nullptr;
}